

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.h
# Opt level: O3

void __thiscall lf::io::VtkWriter::~VtkWriter(VtkWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  pointer pCVar5;
  pointer pMVar6;
  long lVar7;
  
  WriteToFile(&this->vtk_file_,&this->filename_);
  lVar7 = 0;
  do {
    *(undefined ***)
     ((long)&(this->aux_node_offset_)._M_elems[1].super_MeshDataSet<unsigned_int>._vptr_MeshDataSet
     + lVar7) = &PTR_operator___0034dca8;
    lVar2 = *(long *)((long)&(this->aux_node_offset_)._M_elems[1].data_.m_holder.m_capacity + lVar7)
    ;
    if (lVar2 != 0) {
      operator_delete(*(void **)((long)&(this->aux_node_offset_)._M_elems[1].data_.m_holder.m_start
                                + lVar7),lVar2 << 2);
    }
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(this->aux_node_offset_)._M_elems[1].mesh_.
                      super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + lVar7);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    lVar7 = lVar7 + -0x38;
  } while (lVar7 != -0x70);
  lVar7 = 0;
  do {
    free(*(void **)((long)&(this->aux_nodes_)._M_elems[4].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x78);
  pcVar4 = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
  ::~vector(&(this->vtk_file_).cell_data);
  std::
  vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
  ::~vector(&(this->vtk_file_).point_data);
  std::
  vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>
  ::~vector(&(this->vtk_file_).field_data);
  pCVar5 = (this->vtk_file_).unstructured_grid.cell_types.
           super__Vector_base<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar5 != (pointer)0x0) {
    operator_delete(pCVar5,(long)(this->vtk_file_).unstructured_grid.cell_types.
                                 super__Vector_base<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar5);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&(this->vtk_file_).unstructured_grid.cells);
  pMVar6 = (this->vtk_file_).unstructured_grid.points.
           super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar6 != (pointer)0x0) {
    operator_delete(pMVar6,(long)(this->vtk_file_).unstructured_grid.points.
                                 super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar6);
  }
  pcVar4 = (this->vtk_file_).header._M_dataplus._M_p;
  paVar1 = &(this->vtk_file_).header.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    return;
  }
  return;
}

Assistant:

~VtkWriter() { WriteToFile(vtk_file_, filename_); }